

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
          (RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *pRVar1;
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> local_28;
  ShaderResourceBindingVkImpl *local_18;
  ShaderResourceBindingVkImpl *pObj_local;
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this_local;
  
  local_18 = pObj;
  pObj_local = (ShaderResourceBindingVkImpl *)this;
  RefCntWeakPtr(&local_28,pObj);
  pRVar1 = operator=(this,&local_28);
  ~RefCntWeakPtr(&local_28);
  return pRVar1;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }